

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_extract(char *zipname,char *dir,_func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  mz_uint32 mVar1;
  char cVar2;
  mz_bool mVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  mz_uint file_index;
  ulong uVar8;
  bool bVar9;
  mz_zip_archive zip_archive;
  mz_zip_archive_file_stat info;
  char path [32768];
  char symlink_to [32768];
  mz_zip_archive mStack_182f8;
  mz_zip_archive_file_stat mStack_18280;
  char acStack_18038 [32768];
  char acStack_10038 [32768];
  char local_8038 [32776];
  
  memset(acStack_18038,0,0x8000);
  memset(acStack_10038,0,0x8000);
  mStack_182f8.m_archive_size = 0;
  mStack_182f8.m_central_directory_file_ofs = 0;
  mStack_182f8.m_total_files = 0;
  mStack_182f8.m_zip_mode = MZ_ZIP_MODE_INVALID;
  mStack_182f8.m_zip_type = MZ_ZIP_TYPE_INVALID;
  mStack_182f8.m_last_error = MZ_ZIP_NO_ERROR;
  mStack_182f8.m_file_offset_alignment = 0;
  mStack_182f8.m_pAlloc = (mz_alloc_func)0x0;
  mStack_182f8.m_pFree = (mz_free_func)0x0;
  mStack_182f8.m_pRealloc = (mz_realloc_func)0x0;
  mStack_182f8.m_pAlloc_opaque = (void *)0x0;
  mStack_182f8.m_pRead = (mz_file_read_func)0x0;
  mStack_182f8.m_pWrite = (mz_file_write_func)0x0;
  mStack_182f8.m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  mStack_182f8.m_pIO_opaque = (void *)0x0;
  mStack_182f8.m_pState = (mz_zip_internal_state *)0x0;
  uVar7 = 0xffffffff;
  if (dir != (char *)0x0 && zipname != (char *)0x0) {
    uVar5 = strlen(dir);
    if ((uVar5 + 1 < 0x8000) &&
       (mVar3 = mz_zip_reader_init_file(&mStack_182f8,zipname,0), mVar3 != 0)) {
      uVar7 = 0;
      memset(&mStack_18280,0,0x248);
      strcpy(acStack_18038,dir);
      cVar2 = acStack_18038[uVar5 - 1];
      if ((cVar2 != '/') && (cVar2 != '\\')) {
        acStack_18038[uVar5] = '/';
        uVar5 = uVar5 + 1;
      }
      mVar1 = mStack_182f8.m_total_files;
      if (mStack_182f8.m_total_files != 0) {
        file_index = 0;
        uVar7 = 0xffffffff;
        do {
          mVar3 = mz_zip_reader_file_stat(&mStack_182f8,file_index,&mStack_18280);
          if (mVar3 == 0) goto LAB_003b6498;
          strncpy(acStack_18038 + uVar5,mStack_18280.m_filename,0x7fff - uVar5);
          memset(local_8038,0,0x8000);
          if (acStack_18038[0] != '\0') {
            uVar8 = 0;
            cVar2 = acStack_18038[0];
            do {
              if (((cVar2 == '\\') || (cVar2 == '/')) && (uVar8 != 0)) {
                if (cVar2 == '\\') {
                  acStack_18038[uVar8] = '/';
                }
                iVar4 = mkdir(local_8038,0x1ed);
                if ((iVar4 == -1) && (piVar6 = __errno_location(), *piVar6 != 0x11))
                goto LAB_003b6498;
              }
              cVar2 = acStack_18038[uVar8 + 1];
              local_8038[uVar8] = acStack_18038[uVar8];
            } while ((cVar2 != '\0') && (bVar9 = uVar8 < 0x7ffe, uVar8 = uVar8 + 1, bVar9));
          }
          if (((mStack_18280.m_version_made_by._1_1_ | 0x10) == 0x13) &&
             ((mStack_18280.m_external_attr & 0x20000000) != 0)) {
            if ((0x7fff < mStack_18280.m_uncomp_size) ||
               (mVar3 = mz_zip_reader_extract_to_mem_no_alloc
                                  (&mStack_182f8,file_index,acStack_10038,0x7fff,0,(void *)0x0,0),
               mVar3 == 0)) goto LAB_003b6498;
            acStack_10038[mStack_18280.m_uncomp_size] = '\0';
            iVar4 = symlink(acStack_10038,acStack_18038);
            if (iVar4 != 0) goto LAB_003b6498;
          }
          else {
            mVar3 = mz_zip_reader_is_file_a_directory(&mStack_182f8,file_index);
            if (((mVar3 == 0) &&
                (mVar3 = mz_zip_reader_extract_to_file(&mStack_182f8,file_index,acStack_18038,0),
                mVar3 == 0)) ||
               ((0xffff < mStack_18280.m_external_attr &&
                (iVar4 = chmod(acStack_18038,mStack_18280.m_external_attr >> 0x10), iVar4 < 0))))
            goto LAB_003b6498;
          }
          if ((on_extract != (_func_int_char_ptr_void_ptr *)0x0) &&
             (iVar4 = (*on_extract)(acStack_18038,arg), iVar4 < 0)) goto LAB_003b6498;
          file_index = file_index + 1;
        } while (file_index != mVar1);
        uVar7 = 0;
      }
LAB_003b6498:
      mVar3 = mz_zip_reader_end(&mStack_182f8);
      uVar7 = -(uint)(mVar3 == 0) | uVar7;
    }
  }
  return uVar7;
}

Assistant:

int zip_extract(const char *zipname, const char *dir,
                int (*on_extract)(const char *filename, void *arg), void *arg) {
  int status = -1;
  mz_uint i, n;
  char path[MAX_PATH + 1];
  char symlink_to[MAX_PATH + 1];
  mz_zip_archive zip_archive;
  mz_zip_archive_file_stat info;
  size_t dirlen = 0;
  mz_uint32 xattr = 0;

  memset(path, 0, sizeof(path));
  memset(symlink_to, 0, sizeof(symlink_to));
  if (!memset(&(zip_archive), 0, sizeof(zip_archive))) {
    // Cannot memset zip archive
    return -1;
  }

  if (!zipname || !dir) {
    // Cannot parse zip archive name
    return -1;
  }

  dirlen = strlen(dir);
  if (dirlen + 1 > MAX_PATH) {
    return -1;
  }

  // Now try to open the archive.
  if (!mz_zip_reader_init_file(&zip_archive, zipname, 0)) {
    // Cannot initialize zip_archive reader
    return -1;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));

#if defined(_MSC_VER)
  strcpy_s(path, MAX_PATH, dir);
#else
  strcpy(path, dir);
#endif

  if (!ISSLASH(path[dirlen - 1])) {
#if defined(_WIN32) || defined(__WIN32__)
    path[dirlen] = '\\';
#else
    path[dirlen] = '/';
#endif
    ++dirlen;
  }

  // Get and print information about each file in the archive.
  n = mz_zip_reader_get_num_files(&zip_archive);
  for (i = 0; i < n; ++i) {
    if (!mz_zip_reader_file_stat(&zip_archive, i, &info)) {
      // Cannot get information about zip archive;
      goto out;
    }
#if defined(_MSC_VER)
    strncpy_s(&path[dirlen], MAX_PATH - dirlen, info.m_filename,
              MAX_PATH - dirlen);
#else
    strncpy(&path[dirlen], info.m_filename, MAX_PATH - dirlen);
#endif
    if (mkpath(path) < 0) {
      // Cannot make a path
      goto out;
    }

    if ((((info.m_version_made_by >> 8) == 3) ||
         ((info.m_version_made_by >> 8) ==
          19)) // if zip is produced on Unix or macOS (3 and 19 from
               // section 4.4.2.2 of zip standard)
        && info.m_external_attr &
               (0x20 << 24)) { // and has sym link attribute (0x80 is file, 0x40
                               // is directory)
#if defined(_WIN32) || defined(__WIN32__) || defined(_MSC_VER) ||              \
    defined(__MINGW32__)
#else
      if (info.m_uncomp_size > MAX_PATH ||
          !mz_zip_reader_extract_to_mem_no_alloc(&zip_archive, i, symlink_to,
                                                 MAX_PATH, 0, NULL, 0)) {
        goto out;
      }
      symlink_to[info.m_uncomp_size] = '\0';
      if (symlink(symlink_to, path) != 0) {
        goto out;
      }
#endif
    } else {
      if (!mz_zip_reader_is_file_a_directory(&zip_archive, i)) {
        if (!mz_zip_reader_extract_to_file(&zip_archive, i, path, 0)) {
          // Cannot extract zip archive to file
          goto out;
        }
      }

#if defined(_MSC_VER)
#else
      xattr = (info.m_external_attr >> 16) & 0xFFFF;
      if (xattr > 0) {
        if (chmod(path, (mode_t)xattr) < 0) {
          goto out;
        }
      }
#endif
    }

    if (on_extract) {
      if (on_extract(path, arg) < 0) {
        goto out;
      }
    }
  }
  status = 0;

out:
  // Close the archive, freeing any resources it was using
  if (!mz_zip_reader_end(&zip_archive)) {
    // Cannot end zip reader
    status = -1;
  }

  return status;
}